

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v10::detail::write<char,fmt::v10::appender>
                   (appender out,char value,format_specs<char> *specs,locale_ref loc)

{
  ushort uVar1;
  loc_value value_00;
  bool bVar2;
  appender aVar3;
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> arg;
  undefined8 uStack_40;
  undefined4 uStack_34;
  undefined8 uStack_30;
  
  bVar2 = check_char_specs<char>(specs);
  if (bVar2) {
    aVar3 = write_char<char,fmt::v10::appender>(out,value,specs);
    return (appender)aVar3.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  }
  uVar1 = *(ushort *)&specs->field_0x9;
  if ((uVar1 >> 8 & 1) != 0) {
    value_00.value_.value_.field_0.long_long_value._1_7_ = 0;
    value_00.value_.value_.field_0.char_value = value;
    value_00.value_._20_4_ = uStack_34;
    value_00.value_.type_ = 2;
    value_00.value_.value_.field_0.string.size = uStack_40;
    value_00.value_._24_8_ = uStack_30;
    bVar2 = write_loc(out,value_00,specs,loc);
    if (bVar2) {
      return (appender)
             out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    uVar1 = *(ushort *)&specs->field_0x9;
  }
  aVar3 = write_int_noinline<char,fmt::v10::appender,unsigned_int>
                    (out,(write_int_arg<unsigned_int>)
                         ((ulong)*(uint *)(&DAT_0018a0b0 + (ulong)(uVar1 >> 4 & 7) * 4) << 0x20 |
                         (ulong)(byte)value),specs,loc);
  return (appender)aVar3.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value,
                         const format_specs<Char>& specs, locale_ref loc = {})
    -> OutputIt {
  // char is formatted as unsigned char for consistency across platforms.
  using unsigned_type =
      conditional_t<std::is_same<Char, char>::value, unsigned char, unsigned>;
  return check_char_specs(specs)
             ? write_char(out, value, specs)
             : write(out, static_cast<unsigned_type>(value), specs, loc);
}